

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TestSpec::Filter::serializeTo(Filter *this,ostream *out)

{
  pointer puVar1;
  bool bVar2;
  undefined8 in_RAX;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  pointer puVar3;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  unique_ptr<Catch::TestSpec::Pattern> *pattern_1;
  bool bVar4;
  undefined8 uStack_38;
  
  puVar3 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = puVar3 == puVar1;
  uStack_38 = in_RAX;
  if (!bVar4) {
    bVar2 = true;
    do {
      if (!bVar2) {
        uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 6),1);
      }
      (*puVar3->m_ptr->_vptr_Pattern[3])(puVar3->m_ptr,out);
      puVar3 = puVar3 + 1;
      bVar2 = false;
    } while (puVar3 != puVar1);
  }
  puVar3 = (this->m_forbidden).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_forbidden).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      if (!bVar4) {
        uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 7),1);
      }
      (*puVar3->m_ptr->_vptr_Pattern[3])(puVar3->m_ptr,out);
      puVar3 = puVar3 + 1;
      bVar4 = false;
    } while (puVar3 != puVar1);
  }
  return;
}

Assistant:

void TestSpec::Filter::serializeTo( std::ostream& out ) const {
        bool first = true;
        for ( auto const& pattern : m_required ) {
            if ( !first ) {
                out << ' ';
            }
            out << *pattern;
            first = false;
        }
        for ( auto const& pattern : m_forbidden ) {
            if ( !first ) {
                out << ' ';
            }
            out << *pattern;
            first = false;
        }
    }